

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  int *in_RSI;
  size_t amount;
  ucvector tRNS;
  size_t i;
  uint error;
  ucvector *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ucvector *in_stack_ffffffffffffffd8;
  size_t local_20;
  
  ucvector_init((ucvector *)&stack0xffffffffffffffc8);
  if (*in_RSI == 3) {
    in_stack_ffffffffffffffc0 = *(size_t *)(in_RSI + 4);
    local_20 = *(size_t *)(in_RSI + 4);
    while ((local_20 != 0 && (*(char *)(*(long *)(in_RSI + 2) + 3 + (local_20 + -1) * 4) == -1))) {
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 - 1;
      local_20 = local_20 + -1;
    }
    for (local_20 = 0; local_20 != in_stack_ffffffffffffffc0; local_20 = local_20 + 1) {
      ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    }
  }
  else if (*in_RSI == 0) {
    if (in_RSI[6] != 0) {
      ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
      ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    }
  }
  else if ((*in_RSI == 2) && (in_RSI[6] != 0)) {
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
  }
  uVar1 = addChunk(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc0);
  ucvector_cleanup((void *)0x211db1);
  return uVar1;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector tRNS;
  ucvector_init(&tRNS);
  if(info->colortype == LCT_PALETTE)
  {
    size_t amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i)
    {
      if(info->palette[4 * (i - 1) + 3] == 255) --amount;
      else break;
    }
    /*add only alpha channel*/
    for(i = 0; i != amount; ++i) ucvector_push_back(&tRNS, info->palette[4 * i + 3]);
  }
  else if(info->colortype == LCT_GREY)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r % 256));
    }
  }
  else if(info->colortype == LCT_RGB)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r % 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g % 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b % 256));
    }
  }

  error = addChunk(out, "tRNS", tRNS.data, tRNS.size);
  ucvector_cleanup(&tRNS);

  return error;
}